

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O2

void __thiscall
SpeciesTracker::TerminateTranscription
          (SpeciesTracker *this,shared_ptr<PolymerWrapper> *wrapper,string *pol_name,
          string *gene_name)

{
  shared_ptr<Reaction> sStack_28;
  
  Increment(this,pol_name,1);
  std::__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<PolymerWrapper,void>
            ((__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2> *)&sStack_28,
             &wrapper->super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>);
  Signal<std::shared_ptr<Reaction>_>::Emit(&this->propensity_signal_,&sStack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_28.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void SpeciesTracker::TerminateTranscription(
    std::shared_ptr<PolymerWrapper> wrapper, const std::string &pol_name,
    const std::string &gene_name) {
  Increment(pol_name, 1);
  propensity_signal_.Emit(wrapper);
  // CountTermination("transcript");
}